

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O1

void __thiscall cs222::Pass2::writeObjectProgram(Pass2 *this,string *progName,string *progLength)

{
  pointer pcVar1;
  _Map_pointer ppuVar2;
  value_type vVar3;
  _Elt_pointer pbVar4;
  reference pvVar5;
  long *plVar6;
  reference pvVar7;
  ostream *poVar8;
  runtime_error *this_00;
  ulong *puVar9;
  string *psVar10;
  long *plVar11;
  size_type *psVar12;
  _Elt_pointer pbVar13;
  _Map_pointer ppbVar14;
  ulong uVar15;
  _Elt_pointer pbVar16;
  size_type __n;
  string temp;
  string textRecLength;
  string textRec;
  string headerRecord;
  string objProgPath;
  string endRecord;
  ofstream ofs;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modRecords;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textRecords;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coAdd;
  value_type local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  string *local_428;
  string *local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  char *local_3f8;
  ulong local_3f0;
  char local_3e8;
  undefined7 uStack_3e7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  _Map_pointer local_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long lStack_398;
  char *local_390;
  long local_388;
  char local_380;
  undefined7 uStack_37f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string *local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  byte abStack_308 [8];
  uint auStack_300 [22];
  ios_base local_2a8 [120];
  ios_base local_230 [264];
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  pcVar1 = (this->srcFileName)._M_dataplus._M_p;
  local_428 = progLength;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,pcVar1,pcVar1 + (this->srcFileName)._M_string_length);
  std::__cxx11::string::append((char *)&local_3d8);
  local_3f8 = &local_3e8;
  local_3f0 = 0;
  local_3e8 = '\0';
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_d8,0);
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_128,0);
  local_390 = &local_380;
  local_388 = 0;
  local_380 = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,"H",
                 progName);
  std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._0_8_ != &local_318) {
    operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
  }
  while (local_3f0 < 7) {
    std::__cxx11::string::append((char *)&local_3f8);
  }
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  for (uVar15 = 0;
      ppuVar2 = (this->correspondingAddresses).
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,
      uVar15 < ((long)(this->correspondingAddresses).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_last -
                (long)(this->correspondingAddresses).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this->correspondingAddresses).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur -
                (long)(this->correspondingAddresses).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first >> 3) +
               ((((ulong)((long)ppuVar2 -
                         (long)(this->correspondingAddresses).
                               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x40; uVar15 = uVar15 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_328);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
    *(uint *)((long)auStack_300 + *(long *)(local_318._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(local_318._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_318);
    std::operator>>((istream *)local_328,(string *)&local_468);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88,&local_468);
    while (pvVar5 = std::
                    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_88,uVar15), pvVar5->_M_string_length < 6) {
      pvVar5 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88,uVar15);
      std::operator+(&local_448,"0",pvVar5);
      pvVar5 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88,uVar15);
      std::__cxx11::string::operator=((string *)pvVar5,(string *)&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
    std::ios_base::~ios_base(local_2a8);
  }
  pvVar5 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88,0);
  std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)(pvVar5->_M_dataplus)._M_p);
  if (local_428->_M_string_length < 6) {
    do {
      psVar10 = local_428;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                     "0",local_428);
      std::__cxx11::string::operator=((string *)psVar10,(string *)local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._0_8_ != &local_318) {
        operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
      }
    } while (local_428->_M_string_length < 6);
  }
  std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)(local_428->_M_dataplus)._M_p);
  psVar10 = (string *)
            (this->modificationAddresses).
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_350 = (string *)
              (this->modificationAddresses).
              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
  if (psVar10 != local_350) {
    local_420 = (string *)
                (this->modificationAddresses).
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start._M_last;
    local_3b8 = (this->modificationAddresses).
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
    do {
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      local_428 = psVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
      std::__cxx11::stringstream::stringstream((stringstream *)local_328);
      *(uint *)((long)auStack_300 + *(long *)(local_318._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_300 + *(long *)(local_318._M_allocated_capacity - 0x18)) &
           0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)&local_318);
      std::operator>>((istream *)local_328,(string *)&local_468);
      while (local_468._M_string_length < 6) {
        std::operator+(&local_448,"0",&local_468);
        std::__cxx11::string::operator=((string *)&local_468,(string *)&local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+(&local_418,"M",&local_468);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_418);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_448.field_2._M_allocated_capacity = *puVar9;
        local_448.field_2._8_8_ = plVar6[3];
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      }
      else {
        local_448.field_2._M_allocated_capacity = *puVar9;
        local_448._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_448._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_468,(string *)&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_128,&local_468);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
      std::ios_base::~ios_base(local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      psVar10 = (string *)&local_428->_M_string_length;
      if (psVar10 == local_420) {
        psVar10 = (string *)local_3b8[1];
        local_3b8 = local_3b8 + 1;
        local_420 = psVar10 + 0x10;
      }
    } while (psVar10 != local_350);
  }
  pvVar5 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,"E",
                 pvVar5);
  std::__cxx11::string::operator=((string *)&local_390,(string *)local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._0_8_ != &local_318) {
    operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
  }
  local_420 = (string *)&this->correspondingAddresses;
  local_428 = (string *)&this->objectCode;
  uVar15 = 0;
  do {
    __n = (size_type)(int)uVar15;
    ppbVar14 = (this->objectCode).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    if (((long)(this->objectCode).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(this->objectCode).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
        ((long)(this->objectCode).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->objectCode).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
        ((((ulong)((long)ppbVar14 -
                  (long)(this->objectCode).
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppbVar14 == (_Map_pointer)0x0)) * 0x10 <= __n) {
      std::ofstream::ofstream(local_328,(string *)&local_3d8,_S_out);
      if ((abStack_308[*(long *)(local_328._0_8_ + -0x18)] & 5) == 0) {
        std::operator+(&local_468,"Writing object program to ",&local_3d8);
        logDebug(&local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        *(uint *)(abStack_308 + *(long *)(local_328._0_8_ + -0x18) + -8) =
             *(uint *)(abStack_308 + *(long *)(local_328._0_8_ + -0x18) + -8) | 0x20;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_328,local_3f8,local_3f0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pbVar4 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          pbVar13 = local_d8._M_impl.super__Deque_impl_data._M_start._M_last;
          ppbVar14 = local_d8._M_impl.super__Deque_impl_data._M_start._M_node;
          pbVar16 = local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          do {
            local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
            pcVar1 = (pbVar16->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_468,pcVar1,pcVar1 + pbVar16->_M_string_length);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_328,local_468._M_dataplus._M_p,
                                local_468._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
            pbVar16 = pbVar16 + 1;
            if (pbVar16 == pbVar13) {
              pbVar16 = ppbVar14[1];
              ppbVar14 = ppbVar14 + 1;
              pbVar13 = pbVar16 + 0x10;
            }
          } while (pbVar16 != pbVar4);
        }
        pbVar4 = local_128._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_128._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_128._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          pbVar13 = local_128._M_impl.super__Deque_impl_data._M_start._M_last;
          ppbVar14 = local_128._M_impl.super__Deque_impl_data._M_start._M_node;
          pbVar16 = local_128._M_impl.super__Deque_impl_data._M_start._M_cur;
          do {
            local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
            pcVar1 = (pbVar16->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_468,pcVar1,pcVar1 + pbVar16->_M_string_length);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_328,local_468._M_dataplus._M_p,
                                local_468._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
            pbVar16 = pbVar16 + 1;
            if (pbVar16 == pbVar13) {
              pbVar16 = ppbVar14[1];
              ppbVar14 = ppbVar14 + 1;
              pbVar13 = pbVar16 + 0x10;
            }
          } while (pbVar16 != pbVar4);
        }
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_328,local_390,local_388);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::ofstream::close();
        local_328._0_8_ = _VTT;
        *(undefined8 *)(local_328 + *(long *)(_VTT + -0x18)) = __filebuf;
        std::filebuf::~filebuf((filebuf *)(local_328 + 8));
        std::ios_base::~ios_base(local_230);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
        if (local_390 != &local_380) {
          operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_d8);
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Cannot open file: ","");
      std::operator+(&local_468,&local_448,&local_3d8);
      std::runtime_error::runtime_error(this_00,(string *)&local_468);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar5 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88,__n);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    pcVar1 = (pvVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_468,pcVar1,pcVar1 + pvVar5->_M_string_length);
    local_448._M_string_length = 0;
    local_448.field_2._M_allocated_capacity =
         local_448.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    pvVar5 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_428,__n);
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    pcVar1 = (pvVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,pcVar1,pcVar1 + pvVar5->_M_string_length);
    for (; (uVar15 = __n + 1, local_418._M_string_length < 0x3c &&
           (ppbVar14 = (this->objectCode).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node,
           uVar15 < ((long)(this->objectCode).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(this->objectCode).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
                    ((long)(this->objectCode).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(this->objectCode).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
                    ((((ulong)((long)ppbVar14 -
                              (long)(this->objectCode).
                                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(ppbVar14 == (_Map_pointer)0x0)) * 0x10)); __n = __n + 1) {
      pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_420,uVar15);
      vVar3 = *pvVar7;
      pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_420,__n);
      if ((4 < vVar3 - *pvVar7) ||
         (pvVar5 = std::
                   deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_428,uVar15),
         0x3c < local_418._M_string_length + pvVar5->_M_string_length)) break;
      pvVar5 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_428,uVar15);
      std::__cxx11::string::_M_append((char *)&local_418,(ulong)(pvVar5->_M_dataplus)._M_p);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_328);
    *(uint *)((long)auStack_300 + *(long *)(local_318._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(local_318._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_318);
    std::operator>>((istream *)local_328,(string *)&local_448);
    while (local_448._M_string_length < 2) {
      std::operator+(&local_370,"0",&local_448);
      std::__cxx11::string::operator=((string *)&local_448,(string *)&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+(&local_348,"T",&local_468);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_348,(ulong)local_448._M_dataplus._M_p);
    local_3b0 = &local_3a0;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_3a0 = *plVar11;
      lStack_398 = plVar6[3];
    }
    else {
      local_3a0 = *plVar11;
      local_3b0 = (long *)*plVar6;
    }
    local_3a8 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_3b0,(ulong)local_418._M_dataplus._M_p);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_370.field_2._M_allocated_capacity = *psVar12;
      local_370.field_2._8_8_ = plVar6[3];
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    }
    else {
      local_370.field_2._M_allocated_capacity = *psVar12;
      local_370._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_370._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_418,(string *)&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_3b0 != &local_3a0) {
      operator_delete(local_3b0,local_3a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8,&local_418);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
    std::ios_base::~ios_base(local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void Pass2::writeObjectProgram(std::string& progName,std::string& progLength) {
        std::string objProgPath = srcFileName + ".objprog";

        std::string headerRecord;
        std::deque<std::string> textRecords;
        std::deque<std::string> modRecords;
        std::string endRecord;

        headerRecord = "H" + progName;
        while(headerRecord.length() < 7)
            headerRecord += " ";

        std::deque<std::string> coAdd; //bta3tna elly hanshta8l 3leha
        for (int i = 0; i < correspondingAddresses.size(); ++i) {

            //DEBUG:
                    //std::cout << "Address bta3 " << i << " howa " << correspondingAddresses[i] << std::endl;

            std::stringstream ss;
            std::string temp = "";
            ss << std::hex << correspondingAddresses[i];
            ss >> temp;
            coAdd.push_back(temp);

            while(coAdd.at(i).length() < 6)
                coAdd.at(i) = "0" + coAdd.at(i);

        }

        headerRecord += coAdd.at(0);

        while(progLength.length() < 6)
            progLength = "0" + progLength;

        headerRecord += progLength; // now header record is done

        // now modification record era nya nya

        for (auto it : modificationAddresses) {

            std::string modRec = "";
            std::stringstream ss;
            ss << std::hex << it + 1;
            ss >> modRec;


            while (modRec.length() < 6)
                modRec = "0" + modRec;

            modRec = "M" + modRec + "05";
            modRecords.push_back(modRec);
        }

        endRecord = "E" + coAdd.at(0);

        for (int i = 0; i < objectCode.size(); ++i) {

            std::string startAdd = coAdd.at(i);
            std::string textRecLength;
            std::string textRec = objectCode.at(i);
            ++i;

            while( (textRec.length() < 60) && (i < objectCode.size()) ){
                if((correspondingAddresses.at(i) - correspondingAddresses.at(i-1)) <= 4){
                    if (objectCode.at(i).length() + textRec.length() <= 60){
                        textRec += objectCode.at(i);
                        ++i;
                    } else{
                        break;
                    }
                } else {
                    break;
                }
            }

            std::stringstream ss;
            ss << std::hex << textRec.length()/2;
            ss >> textRecLength;

            while (textRecLength.length() < 2){
                textRecLength = "0" + textRecLength;
            }

            textRec = "T" + startAdd + textRecLength + textRec;
            textRecords.push_back(textRec);

            --i;
        }


        // writing to file

        std::ofstream ofs(objProgPath);
        if (!ofs)
            throw std::runtime_error(std::string("Cannot open file: ") + objProgPath);

        logDebug("Writing object program to " + objProgPath);
        ofs.setf(std::ios::left);

        ofs << headerRecord << std::endl;

        for(auto it : textRecords)
            ofs << it << std::endl;

        for(auto it : modRecords)
            ofs << it << std::endl;

        ofs << endRecord << std::endl;

        ofs.close();

    }